

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

void tinyexr::hufPackEncTable(longlong *hcode,int im,int iM,char **pcode)

{
  ulong *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  
  pcVar6 = *pcode;
  if (iM < im) {
    uVar7 = 0;
    iVar3 = 0;
  }
  else {
    uVar7 = 0;
    iVar8 = 0;
    do {
      lVar10 = (long)im;
      puVar1 = (ulong *)(hcode + lVar10);
      if ((*puVar1 & 0x3f) == 0) {
        uVar2 = 1;
        if (im < iM) {
          uVar4 = 1;
          while (uVar2 = uVar4, (*(byte *)(hcode + lVar10 + 1) & 0x3f) == 0) {
            lVar10 = lVar10 + 1;
            uVar2 = uVar4 + 1;
            if ((iM <= lVar10) || (bVar11 = 0x103 < uVar4, uVar4 = uVar2, bVar11)) break;
          }
          im = (int)lVar10;
        }
        if (uVar2 < 2) goto LAB_0012584f;
        iVar5 = im;
        if (uVar2 < 6) {
          uVar7 = uVar7 << 6 | (ulong)(uVar2 + 0x39);
          iVar3 = iVar8 + 6;
          if (iVar8 < 2) goto LAB_0012588b;
          iVar8 = iVar8 + 0xe;
          do {
            iVar3 = iVar3 + -8;
            *pcVar6 = (char)((long)uVar7 >> ((byte)iVar3 & 0x3f));
            pcVar6 = pcVar6 + 1;
            iVar8 = iVar8 + -8;
          } while (0xf < iVar8);
          goto LAB_00125884;
        }
        iVar9 = iVar8 + 6;
        uVar7 = uVar7 << 6 | 0x3f;
        if (1 < iVar8) {
          iVar8 = iVar8 + 0xe;
          do {
            iVar3 = iVar8;
            iVar9 = iVar9 + -8;
            *pcVar6 = (char)((long)uVar7 >> ((byte)iVar9 & 0x3f));
            pcVar6 = pcVar6 + 1;
            iVar8 = iVar3 + -8;
          } while (0xf < iVar8);
          iVar9 = iVar3 + -0x10;
        }
        uVar7 = uVar7 << 8 | (ulong)(uVar2 - 6);
        iVar3 = iVar9 + 8;
        if (-1 < iVar9) {
          iVar8 = iVar9 + 0x10;
          do {
            iVar9 = iVar8;
            iVar3 = iVar3 + -8;
            *pcVar6 = (char)((long)uVar7 >> ((byte)iVar3 & 0x3f));
            pcVar6 = pcVar6 + 1;
            iVar8 = iVar9 + -8;
          } while (0xf < iVar8);
          iVar3 = iVar9 + -0x10;
        }
      }
      else {
LAB_0012584f:
        uVar7 = *puVar1 & 0x3f | uVar7 << 6;
        iVar3 = iVar8 + 6;
        iVar5 = im;
        if (1 < iVar8) {
          iVar8 = iVar8 + 0xe;
          do {
            iVar3 = iVar3 + -8;
            *pcVar6 = (char)((long)uVar7 >> ((byte)iVar3 & 0x3f));
            pcVar6 = pcVar6 + 1;
            iVar8 = iVar8 + -8;
          } while (0xf < iVar8);
LAB_00125884:
          iVar3 = iVar8 + -8;
          iVar5 = im;
        }
      }
LAB_0012588b:
      im = iVar5 + 1;
      iVar8 = iVar3;
    } while (iVar5 < iM);
  }
  if (0 < iVar3) {
    *pcVar6 = (char)(uVar7 << (8U - (char)iVar3 & 0x3f));
    pcVar6 = pcVar6 + 1;
  }
  *pcode = pcVar6;
  return;
}

Assistant:

void hufPackEncTable(
    const long long *hcode,  // i : encoding table [HUF_ENCSIZE]
    int im,                  // i : min hcode index
    int iM,                  // i : max hcode index
    char **pcode)            //  o: ptr to packed table (updated)
{
  char *p = *pcode;
  long long c = 0;
  int lc = 0;

  for (; im <= iM; im++) {
    int l = hufLength(hcode[im]);

    if (l == 0) {
      int zerun = 1;

      while ((im < iM) && (zerun < LONGEST_LONG_RUN)) {
        if (hufLength(hcode[im + 1]) > 0) break;
        im++;
        zerun++;
      }

      if (zerun >= 2) {
        if (zerun >= SHORTEST_LONG_RUN) {
          outputBits(6, LONG_ZEROCODE_RUN, c, lc, p);
          outputBits(8, zerun - SHORTEST_LONG_RUN, c, lc, p);
        } else {
          outputBits(6, SHORT_ZEROCODE_RUN + zerun - 2, c, lc, p);
        }
        continue;
      }
    }

    outputBits(6, l, c, lc, p);
  }

  if (lc > 0) *p++ = (unsigned char)(c << (8 - lc));

  *pcode = p;
}